

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::LegacyReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  LegacyReporterAdapter *this_00;
  XmlReporter *this_01;
  Ptr<Catch::IReporter> local_20;
  ReporterConfig *local_18;
  ReporterConfig *config_local;
  ReporterFactory *this_local;
  
  local_18 = config;
  config_local = (ReporterConfig *)this;
  this_00 = (LegacyReporterAdapter *)operator_new(0x18);
  this_01 = (XmlReporter *)operator_new(0x78);
  XmlReporter::XmlReporter(this_01,local_18);
  Ptr<Catch::IReporter>::Ptr(&local_20,(IReporter *)this_01);
  LegacyReporterAdapter::LegacyReporterAdapter(this_00,&local_20);
  Ptr<Catch::IReporter>::~Ptr(&local_20);
  return (IStreamingReporter *)this_00;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new LegacyReporterAdapter( new T( config ) );
            }